

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * google::protobuf::internal::
       WireFormatParser<google::protobuf::Message::_InternalParse(char_const*,google::protobuf::internal::ParseContext*)::ReflectiveFieldParser>
                 (ReflectiveFieldParser *field_parser,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  char *pcVar2;
  ParseContext *in_RDX;
  char *in_RSI;
  uint32 tag;
  uint32 *unaff_retaddr;
  ParseContext *in_stack_00000050;
  char *in_stack_00000058;
  ReflectiveFieldParser *in_stack_00000060;
  uint64 in_stack_00000068;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  char *local_18;
  undefined8 in_stack_fffffffffffffff8;
  
  local_18 = in_RSI;
  while( true ) {
    bVar1 = ParseContext::Done(in_RDX,(char **)CONCAT44(in_stack_ffffffffffffffdc,
                                                        in_stack_ffffffffffffffd8));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return local_18;
    }
    pcVar2 = ReadTag((char *)ctx,unaff_retaddr,(uint32)((ulong)in_stack_fffffffffffffff8 >> 0x20));
    if (pcVar2 == (char *)0x0) break;
    if ((in_stack_ffffffffffffffdc == 0) || ((in_stack_ffffffffffffffdc & 7) == 4)) {
      EpsCopyInputStream::SetLastTag(&in_RDX->super_EpsCopyInputStream,in_stack_ffffffffffffffdc);
      return pcVar2;
    }
    local_18 = FieldParser<google::protobuf::Message::_InternalParse(char_const*,google::protobuf::internal::ParseContext*)::ReflectiveFieldParser>
                         (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050);
    if (local_18 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* WireFormatParser(T& field_parser,
                                                      const char* ptr,
                                                      ParseContext* ctx) {
  while (!ctx->Done(&ptr)) {
    uint32 tag;
    ptr = ReadTag(ptr, &tag);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
    if (tag == 0 || (tag & 7) == 4) {
      ctx->SetLastTag(tag);
      return ptr;
    }
    ptr = FieldParser(tag, field_parser, ptr, ctx);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
  }
  return ptr;
}